

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fRandomFragmentOpTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles2::Functional::RandomFragmentOpCase::iterate(RandomFragmentOpCase *this)

{
  TextureFormat TVar1;
  TextureFormat TVar2;
  Vec4 *vec;
  CallLogWrapper *this_00;
  TextureLevel *pTVar3;
  TextureFormat TVar4;
  float fVar5;
  int iVar6;
  int iVar7;
  TestLog *pTVar8;
  QuadRenderer *this_01;
  ReferenceQuadRenderer *this_02;
  RenderContext *context;
  bool bVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  deUint32 dVar13;
  GLenum GVar14;
  undefined4 extraout_var;
  RenderTarget *pRVar16;
  TextureFormat *pTVar17;
  uint uVar18;
  int iVar19;
  pointer pcVar20;
  TextureLevel *pTVar21;
  char *pcVar22;
  int iVar23;
  void *pvVar24;
  long lVar25;
  pointer pRVar26;
  Surface referenceImg;
  Surface renderedImg;
  vector<deqp::gls::InteractionTestUtil::RenderCommand,_std::allocator<deqp::gls::InteractionTestUtil::RenderCommand>_>
  commands;
  UVec4 threshold;
  Vec4 clearColor;
  ScopedLogSection iterSection;
  Random rnd;
  FragmentOperationState refState;
  undefined1 local_328 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_318;
  Surface local_300;
  Surface local_2e8;
  int local_2cc;
  vector<deqp::gls::InteractionTestUtil::RenderCommand,_std::allocator<deqp::gls::InteractionTestUtil::RenderCommand>_>
  local_2c8;
  undefined1 local_2a8 [40];
  undefined1 local_280 [16];
  pointer local_270 [3];
  Vec4 local_258;
  ScopedLogSection local_240;
  undefined1 local_238 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_228;
  undefined1 local_210 [16];
  TextureLevel *local_200 [3];
  undefined1 local_1e8 [40];
  deRandom local_1c0;
  undefined1 local_1b0 [8];
  float fStack_1a8;
  float fStack_1a4;
  float local_1a0 [2];
  undefined1 auStack_198 [16];
  float afStack_188 [2];
  float local_180;
  float fStack_17c;
  float fStack_178;
  float fStack_174;
  float local_170;
  float fStack_16c;
  float fStack_168;
  float fStack_164;
  float local_160 [4];
  undefined1 local_150 [16];
  undefined8 local_140;
  undefined8 uStack_138;
  float local_130 [64];
  long lVar15;
  
  iVar10 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar15 = CONCAT44(extraout_var,iVar10);
  pRVar16 = Context::getRenderTarget((this->super_TestCase).m_context);
  local_2cc = pRVar16->m_numSamples;
  uVar12 = (this->m_seed >> 0x10 ^ this->m_seed ^ 0x3d) * 9;
  uVar18 = ((uint)this->m_iterNdx >> 0x10 ^ this->m_iterNdx ^ 0x3d) * 9;
  uVar11 = tcu::CommandLine::getBaseSeed
                     (((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_cmdLine);
  uVar11 = (uVar11 >> 0x10 ^ uVar11 ^ 0x3d) * 9;
  uVar12 = (uVar11 >> 4 ^ uVar11) * 0x27d4eb2d ^
           (uVar18 >> 4 ^ uVar18) * 0x27d4eb2d ^ (uVar12 >> 4 ^ uVar12) * 0x27d4eb2d;
  deRandom_init(&local_1c0,uVar12 >> 0xf ^ uVar12);
  iVar10 = (this->m_refColorBuffer->m_size).m_data[0];
  iVar19 = (this->m_refColorBuffer->m_size).m_data[1];
  pRVar16 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar6 = pRVar16->m_width;
  dVar13 = deRandom_getUint32(&local_1c0);
  uVar12 = dVar13 % ((iVar6 - iVar10) + 1U);
  pRVar16 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar6 = pRVar16->m_height;
  dVar13 = deRandom_getUint32(&local_1c0);
  uVar18 = dVar13 % ((iVar6 - iVar19) + 1U);
  tcu::Surface::Surface(&local_2e8,iVar10,iVar19);
  tcu::Surface::Surface(&local_300,iVar10,iVar19);
  local_258.m_data[0] = (float)0x3e800000;
  local_258.m_data[1] = (float)0x3f000000;
  local_258.m_data[2] = (float)0x3f400000;
  local_258.m_data[3] = (float)0x3f800000;
  pTVar8 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  TVar4 = (TextureFormat)((long)local_2a8 + 0x10);
  local_2a8._0_8_ = TVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2a8,"Iteration","");
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
  std::ostream::operator<<(local_1b0,this->m_iterNdx);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b0);
  std::ios_base::~ios_base((ios_base *)&local_140);
  pcVar20 = (pointer)0xf;
  if ((TextureFormat)local_2a8._0_8_ != TVar4) {
    pcVar20 = (pointer)local_2a8._16_8_;
  }
  if (pcVar20 < (pointer)(local_280._8_8_ + CONCAT44(local_2a8._12_4_,local_2a8._8_4_))) {
    pcVar20 = (pointer)0xf;
    if ((pointer *)local_280._0_8_ != local_270) {
      pcVar20 = local_270[0];
    }
    if (pcVar20 < (pointer)(local_280._8_8_ + CONCAT44(local_2a8._12_4_,local_2a8._8_4_)))
    goto LAB_00f8a18e;
    pTVar17 = (TextureFormat *)
              std::__cxx11::string::replace((ulong)local_280,0,(char *)0x0,local_2a8._0_8_);
  }
  else {
LAB_00f8a18e:
    pTVar17 = (TextureFormat *)std::__cxx11::string::_M_append(local_2a8,local_280._0_8_);
  }
  local_328._0_8_ = &local_318;
  TVar1 = (TextureFormat)(pTVar17 + 2);
  if (*pTVar17 == TVar1) {
    local_318._M_allocated_capacity = *(undefined8 *)TVar1;
    local_318._8_4_ = pTVar17[3].order;
    local_318._12_4_ = pTVar17[3].type;
  }
  else {
    local_318._M_allocated_capacity = *(undefined8 *)TVar1;
    local_328._0_8_ = *pTVar17;
  }
  local_328._8_8_ = pTVar17[1];
  *pTVar17 = TVar1;
  pTVar17[1].order = R;
  pTVar17[1].type = SNORM_INT8;
  *(char *)TVar1 = '\0';
  TVar1 = (TextureFormat)((long)local_1e8 + 0x10);
  local_1e8._0_8_ = TVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"Iteration ","");
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
  std::ostream::operator<<(local_1b0,this->m_iterNdx);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b0);
  std::ios_base::~ios_base((ios_base *)&local_140);
  pTVar3 = (TextureLevel *)((long)((IVec3 *)(local_210._8_8_ + 8))->m_data + local_1e8._8_8_ + -8);
  pTVar21 = (TextureLevel *)0xf;
  if ((TextureFormat)local_1e8._0_8_ != TVar1) {
    pTVar21 = (TextureLevel *)local_1e8._16_8_;
  }
  if (pTVar21 < pTVar3) {
    pTVar21 = (TextureLevel *)0xf;
    if ((TextureLevel **)local_210._0_8_ != local_200) {
      pTVar21 = local_200[0];
    }
    if (pTVar3 <= pTVar21) {
      pTVar17 = (TextureFormat *)
                std::__cxx11::string::replace((ulong)local_210,0,(char *)0x0,local_1e8._0_8_);
      goto LAB_00f8a2fa;
    }
  }
  pTVar17 = (TextureFormat *)std::__cxx11::string::_M_append(local_1e8,local_210._0_8_);
LAB_00f8a2fa:
  local_238._0_8_ = &local_228;
  TVar2 = (TextureFormat)(pTVar17 + 2);
  if (*pTVar17 == TVar2) {
    local_228._M_allocated_capacity = *(undefined8 *)TVar2;
    local_228._8_8_ = pTVar17[3];
  }
  else {
    local_228._M_allocated_capacity = *(undefined8 *)TVar2;
    local_238._0_8_ = *pTVar17;
  }
  local_238._8_8_ = pTVar17[1];
  *pTVar17 = TVar2;
  pTVar17[1].order = R;
  pTVar17[1].type = SNORM_INT8;
  *(char *)TVar2 = '\0';
  tcu::ScopedLogSection::ScopedLogSection(&local_240,pTVar8,(string *)local_328,(string *)local_238)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._0_8_ != &local_228) {
    operator_delete((void *)local_238._0_8_,local_228._M_allocated_capacity + 1);
  }
  if ((TextureLevel **)local_210._0_8_ != local_200) {
    operator_delete((void *)local_210._0_8_,(ulong)((long)&(local_200[0]->m_format).order + 1));
  }
  if ((TextureFormat)local_1e8._0_8_ != TVar1) {
    operator_delete((void *)local_1e8._0_8_,
                    (ulong)((long)&((TextureFormat *)local_1e8._16_8_)->order + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_328._0_8_ != &local_318) {
    operator_delete((void *)local_328._0_8_,local_318._M_allocated_capacity + 1);
  }
  if ((pointer *)local_280._0_8_ != local_270) {
    operator_delete((void *)local_280._0_8_,(ulong)(local_270[0] + 1));
  }
  if ((TextureFormat)local_2a8._0_8_ != TVar4) {
    operator_delete((void *)local_2a8._0_8_,(ulong)(local_2a8._16_8_ + 1));
  }
  local_2c8.
  super__Vector_base<deqp::gls::InteractionTestUtil::RenderCommand,_std::allocator<deqp::gls::InteractionTestUtil::RenderCommand>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2c8.
  super__Vector_base<deqp::gls::InteractionTestUtil::RenderCommand,_std::allocator<deqp::gls::InteractionTestUtil::RenderCommand>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2c8.
  super__Vector_base<deqp::gls::InteractionTestUtil::RenderCommand,_std::allocator<deqp::gls::InteractionTestUtil::RenderCommand>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  deqp::gls::InteractionTestUtil::computeRandomRenderCommands
            ((Random *)&local_1c0,(ApiType)0x2,3,iVar10,iVar19,&local_2c8);
  (**(code **)(lVar15 + 0x4e8))(0xc11);
  (**(code **)(lVar15 + 0x238))(1,1,1,1);
  (**(code **)(lVar15 + 0x4a8))(1);
  (**(code **)(lVar15 + 0x12d8))(0xffffffff);
  this_00 = &this->m_callLogWrapper;
  glu::CallLogWrapper::glClearColor
            (this_00,local_258.m_data[0],local_258.m_data[1],local_258.m_data[2],local_258.m_data[3]
            );
  glu::CallLogWrapper::glClearDepthf(this_00,1.0);
  glu::CallLogWrapper::glClearStencil(this_00,0);
  glu::CallLogWrapper::glClear(this_00,0x4500);
  glu::CallLogWrapper::glViewport(this_00,uVar12,uVar18,iVar10,iVar19);
  if (local_2c8.
      super__Vector_base<deqp::gls::InteractionTestUtil::RenderCommand,_std::allocator<deqp::gls::InteractionTestUtil::RenderCommand>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_2c8.
      super__Vector_base<deqp::gls::InteractionTestUtil::RenderCommand,_std::allocator<deqp::gls::InteractionTestUtil::RenderCommand>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pRVar26 = local_2c8.
              super__Vector_base<deqp::gls::InteractionTestUtil::RenderCommand,_std::allocator<deqp::gls::InteractionTestUtil::RenderCommand>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      if ((pRVar26->state).scissorTestEnabled == true) {
        glu::CallLogWrapper::glEnable(this_00,0xc11);
        glu::CallLogWrapper::glScissor
                  (this_00,(pRVar26->state).scissorRectangle.left + uVar12,
                   (pRVar26->state).scissorRectangle.bottom + uVar18,
                   (pRVar26->state).scissorRectangle.width,(pRVar26->state).scissorRectangle.height)
        ;
      }
      else {
        glu::CallLogWrapper::glDisable(this_00,0xc11);
      }
      if ((pRVar26->state).stencilTestEnabled == true) {
        glu::CallLogWrapper::glEnable(this_00,0xb90);
        lVar25 = 0xd0;
        do {
          uVar11 = lVar25 == 0xec | 0x404;
          glu::CallLogWrapper::glStencilFuncSeparate
                    (this_00,uVar11,*(GLenum *)((long)(&(pRVar26->quad).posA + -3) + lVar25),
                     *(GLint *)((long)(pRVar26->quad).posA.m_data + lVar25 + -0x14),
                     *(GLuint *)((long)(&(pRVar26->quad).posA + -2) + lVar25));
          glu::CallLogWrapper::glStencilOpSeparate
                    (this_00,uVar11,*(GLenum *)((long)(pRVar26->quad).posA.m_data + lVar25 + -0xc),
                     *(GLenum *)((long)(&(pRVar26->quad).posA + -1) + lVar25),
                     *(GLenum *)((long)(pRVar26->quad).posA.m_data + lVar25 + -4));
          glu::CallLogWrapper::glStencilMaskSeparate
                    (this_00,uVar11,*(GLuint *)((long)(pRVar26->quad).posA.m_data + lVar25));
          lVar25 = lVar25 + 0x1c;
        } while (lVar25 == 0xec);
      }
      else {
        glu::CallLogWrapper::glDisable(this_00,0xb90);
      }
      if ((pRVar26->state).depthTestEnabled == true) {
        glu::CallLogWrapper::glEnable(this_00,0xb71);
        glu::CallLogWrapper::glDepthFunc(this_00,(pRVar26->state).depthFunc);
        glu::CallLogWrapper::glDepthMask(this_00,(pRVar26->state).depthWriteMask);
      }
      else {
        glu::CallLogWrapper::glDisable(this_00,0xb71);
      }
      if ((pRVar26->state).blendEnabled == true) {
        glu::CallLogWrapper::glEnable(this_00,0xbe2);
        glu::CallLogWrapper::glBlendEquationSeparate
                  (this_00,(pRVar26->state).blendRGBState.equation,
                   (pRVar26->state).blendAState.equation);
        glu::CallLogWrapper::glBlendFuncSeparate
                  (this_00,(pRVar26->state).blendRGBState.srcFunc,
                   (pRVar26->state).blendRGBState.dstFunc,(pRVar26->state).blendAState.srcFunc,
                   (pRVar26->state).blendAState.dstFunc);
        glu::CallLogWrapper::glBlendColor
                  (this_00,(pRVar26->state).blendColor.m_data[0],
                   (pRVar26->state).blendColor.m_data[1],(pRVar26->state).blendColor.m_data[2],
                   (pRVar26->state).blendColor.m_data[3]);
      }
      else {
        glu::CallLogWrapper::glDisable(this_00,0xbe2);
      }
      if ((pRVar26->state).ditherEnabled == true) {
        glu::CallLogWrapper::glEnable(this_00,0xbd0);
      }
      else {
        glu::CallLogWrapper::glDisable(this_00,0xbd0);
      }
      glu::CallLogWrapper::glColorMask
                (this_00,(pRVar26->state).colorMask.m_data[0],(pRVar26->state).colorMask.m_data[1],
                 (pRVar26->state).colorMask.m_data[2],(pRVar26->state).colorMask.m_data[3]);
      local_1b0 = (undefined1  [8])
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&fStack_1a8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&fStack_1a8,"// Quad: ",9);
      tcu::operator<<((ostream *)&fStack_1a8,(Vector<int,_2> *)pRVar26);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&fStack_1a8," -> ",4);
      tcu::operator<<((ostream *)&fStack_1a8,&(pRVar26->quad).posB);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&fStack_1a8,", color: [",10);
      vec = (pRVar26->quad).color;
      tcu::operator<<((ostream *)&fStack_1a8,vec);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&fStack_1a8,", ",2);
      tcu::operator<<((ostream *)&fStack_1a8,(pRVar26->quad).color + 1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&fStack_1a8,", ",2);
      tcu::operator<<((ostream *)&fStack_1a8,(pRVar26->quad).color + 2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&fStack_1a8,", ",2);
      tcu::operator<<((ostream *)&fStack_1a8,(pRVar26->quad).color + 3);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&fStack_1a8,"]",1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&fStack_1a8,", depth: [",10);
      std::ostream::_M_insert<double>((double)(pRVar26->quad).depth[0]);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&fStack_1a8,", ",2);
      std::ostream::_M_insert<double>((double)(pRVar26->quad).depth[1]);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&fStack_1a8,", ",2);
      std::ostream::_M_insert<double>((double)(pRVar26->quad).depth[2]);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&fStack_1a8,", ",2);
      std::ostream::_M_insert<double>((double)(pRVar26->quad).depth[3]);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&fStack_1a8,"]",1);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&fStack_1a8);
      std::ios_base::~ios_base((ios_base *)&uStack_138);
      this_01 = this->m_renderer;
      local_130[4] = 0.0;
      local_130[5] = 0.0;
      local_130[6] = 0.0;
      local_130[7] = 0.0;
      local_130[0] = 0.0;
      local_130[1] = 0.0;
      local_130[2] = 0.0;
      local_130[3] = 0.0;
      local_140._0_4_ = 0.0;
      local_140._4_4_ = 0.0;
      uStack_138._0_4_ = 0.0;
      uStack_138._4_4_ = 0.0;
      local_150._0_4_ = BLENDEQUATION_ADD;
      local_150._4_4_ = BLENDFUNC_ZERO;
      local_150._8_4_ = 0.0;
      local_150._12_4_ = 0.0;
      local_160[0] = 0.0;
      local_160[1] = 0.0;
      local_160[2] = 0.0;
      local_160[3] = 0.0;
      local_1a0 = *(float (*) [2])vec->m_data;
      auStack_198._0_4_ = (TestFunc)(pRVar26->quad).color[0].m_data[2];
      auStack_198._4_4_ = (int)(pRVar26->quad).color[0].m_data[3];
      auStack_198._8_8_ = *(undefined8 *)(pRVar26->quad).color[1].m_data;
      afStack_188 = *(float (*) [2])((pRVar26->quad).color[1].m_data + 2);
      local_180 = (pRVar26->quad).color[2].m_data[0];
      fStack_17c = (pRVar26->quad).color[2].m_data[1];
      fStack_178 = (pRVar26->quad).color[2].m_data[2];
      fStack_174 = (pRVar26->quad).color[2].m_data[3];
      local_170 = (pRVar26->quad).color[3].m_data[0];
      fStack_16c = (pRVar26->quad).color[3].m_data[1];
      fStack_168 = (pRVar26->quad).color[3].m_data[2];
      fStack_164 = (pRVar26->quad).color[3].m_data[3];
      iVar10 = (pRVar26->quad).posB.m_data[0];
      iVar19 = (pRVar26->quad).posA.m_data[0];
      iVar6 = (pRVar26->quad).posA.m_data[1];
      local_1b0._0_4_ = -1.0;
      if (iVar10 < iVar19) {
        local_1b0._0_4_ = 1.0;
      }
      iVar7 = (pRVar26->quad).posB.m_data[1];
      local_1b0._4_4_ = -1.0;
      if (iVar7 < iVar6) {
        local_1b0._4_4_ = 1.0;
      }
      fStack_1a4 = (float)((uint)(iVar6 <= iVar7) * -0x80000000 + -0x40800000);
      fStack_1a8 = (float)((uint)(iVar19 <= iVar10) * -0x80000000 + -0x40800000);
      lVar25 = 0x24;
      do {
        fVar5 = (float)(pRVar26->quad).posA.m_data[lVar25];
        *(float *)(local_1b0 + lVar25 * 4) = fVar5 + fVar5 + -1.0;
        lVar25 = lVar25 + 1;
      } while (lVar25 != 0x28);
      iVar23 = iVar19 - iVar10;
      if (iVar19 < iVar10) {
        iVar10 = iVar19;
      }
      iVar19 = iVar6 - iVar7;
      if (iVar6 < iVar7) {
        iVar7 = iVar6;
      }
      iVar6 = -iVar19;
      if (0 < iVar19) {
        iVar6 = iVar19;
      }
      iVar19 = -iVar23;
      if (0 < iVar23) {
        iVar19 = iVar23;
      }
      (**(code **)(lVar15 + 0x1a00))(iVar10 + uVar12,iVar7 + uVar18,iVar19 + 1,iVar6 + 1);
      deqp::gls::FragmentOpUtil::QuadRenderer::render(this_01,(Quad *)local_1b0);
      pRVar26 = pRVar26 + 1;
    } while (pRVar26 !=
             local_2c8.
             super__Vector_base<deqp::gls::InteractionTestUtil::RenderCommand,_std::allocator<deqp::gls::InteractionTestUtil::RenderCommand>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  GVar14 = glu::CallLogWrapper::glGetError(this_00);
  (**(code **)(lVar15 + 0x650))();
  tcu::TextureLevel::getAccess((PixelBufferAccess *)local_1b0,this->m_refColorBuffer);
  tcu::clear((PixelBufferAccess *)local_1b0,&local_258);
  tcu::TextureLevel::getAccess((PixelBufferAccess *)local_1b0,this->m_refDepthBuffer);
  tcu::clearDepth((PixelBufferAccess *)local_1b0,1.0);
  tcu::TextureLevel::getAccess((PixelBufferAccess *)local_1b0,this->m_refStencilBuffer);
  tcu::clearStencil((PixelBufferAccess *)local_1b0,0);
  if (local_2c8.
      super__Vector_base<deqp::gls::InteractionTestUtil::RenderCommand,_std::allocator<deqp::gls::InteractionTestUtil::RenderCommand>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_2c8.
      super__Vector_base<deqp::gls::InteractionTestUtil::RenderCommand,_std::allocator<deqp::gls::InteractionTestUtil::RenderCommand>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pRVar26 = local_2c8.
              super__Vector_base<deqp::gls::InteractionTestUtil::RenderCommand,_std::allocator<deqp::gls::InteractionTestUtil::RenderCommand>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      rr::FragmentOperationState::FragmentOperationState((FragmentOperationState *)local_1b0);
      pRVar16 = Context::getRenderTarget((this->super_TestCase).m_context);
      translateState(&pRVar26->state,(FragmentOperationState *)local_1b0,pRVar16);
      this_02 = this->m_refRenderer;
      tcu::TextureLevel::getAccess((PixelBufferAccess *)local_2a8,this->m_refColorBuffer);
      deqp::gls::FragmentOpUtil::getMultisampleAccess
                ((PixelBufferAccess *)local_328,(PixelBufferAccess *)local_2a8);
      tcu::TextureLevel::getAccess((PixelBufferAccess *)local_238,this->m_refDepthBuffer);
      deqp::gls::FragmentOpUtil::getMultisampleAccess
                ((PixelBufferAccess *)local_280,(PixelBufferAccess *)local_238);
      tcu::TextureLevel::getAccess((PixelBufferAccess *)local_210,this->m_refStencilBuffer);
      deqp::gls::FragmentOpUtil::getMultisampleAccess
                ((PixelBufferAccess *)local_1e8,(PixelBufferAccess *)local_210);
      deqp::gls::FragmentOpUtil::ReferenceQuadRenderer::render
                (this_02,(PixelBufferAccess *)local_328,(PixelBufferAccess *)local_280,
                 (PixelBufferAccess *)local_1e8,&pRVar26->quad,(FragmentOperationState *)local_1b0);
      pRVar26 = pRVar26 + 1;
    } while (pRVar26 !=
             local_2c8.
             super__Vector_base<deqp::gls::InteractionTestUtil::RenderCommand,_std::allocator<deqp::gls::InteractionTestUtil::RenderCommand>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_328._0_4_ = RGBA;
  local_328._4_4_ = UNORM_INT8;
  pvVar24 = (void *)local_300.m_pixels.m_cap;
  if ((void *)local_300.m_pixels.m_cap != (void *)0x0) {
    pvVar24 = local_300.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_1b0,(TextureFormat *)local_328,local_300.m_width,
             local_300.m_height,1,pvVar24);
  tcu::TextureLevel::getAccess((PixelBufferAccess *)local_328,this->m_refColorBuffer);
  tcu::copy((EVP_PKEY_CTX *)local_1b0,(EVP_PKEY_CTX *)local_328);
  context = ((this->super_TestCase).m_context)->m_renderCtx;
  local_328._0_4_ = RGBA;
  local_328._4_4_ = UNORM_INT8;
  pvVar24 = (void *)local_2e8.m_pixels.m_cap;
  if ((void *)local_2e8.m_pixels.m_cap != (void *)0x0) {
    pvVar24 = local_2e8.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_1b0,(TextureFormat *)local_328,local_2e8.m_width,
             local_2e8.m_height,1,pvVar24);
  glu::readPixels(context,uVar12,uVar18,(PixelBufferAccess *)local_1b0);
  iVar10 = this->m_iterNdx + 1;
  this->m_iterNdx = iVar10;
  getCompareThreshold((RandomFragmentOpCase *)local_2a8);
  pTVar8 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  if (local_2cc < 2) {
    local_328._0_4_ = RGBA;
    local_328._4_4_ = UNORM_INT8;
    if ((void *)local_300.m_pixels.m_cap != (void *)0x0) {
      local_300.m_pixels.m_cap = (size_t)local_300.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)local_1b0,(TextureFormat *)local_328,local_300.m_width,
               local_300.m_height,1,(void *)local_300.m_pixels.m_cap);
    local_280._0_4_ = RGBA;
    local_280._4_4_ = UNORM_INT8;
    if ((void *)local_2e8.m_pixels.m_cap != (void *)0x0) {
      local_2e8.m_pixels.m_cap = (size_t)local_2e8.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)local_328,(TextureFormat *)local_280,local_2e8.m_width,
               local_2e8.m_height,1,(void *)local_2e8.m_pixels.m_cap);
    bVar9 = tcu::intThresholdCompare
                      (pTVar8,"CompareResult","Image Comparison Result",
                       (ConstPixelBufferAccess *)local_1b0,(ConstPixelBufferAccess *)local_328,
                       (UVec4 *)local_2a8,COMPARE_LOG_RESULT);
  }
  else {
    local_328._0_4_ = RGBA;
    local_328._4_4_ = UNORM_INT8;
    if ((void *)local_300.m_pixels.m_cap != (void *)0x0) {
      local_300.m_pixels.m_cap = (size_t)local_300.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)local_1b0,(TextureFormat *)local_328,local_300.m_width,
               local_300.m_height,1,(void *)local_300.m_pixels.m_cap);
    local_280._0_4_ = RGBA;
    local_280._4_4_ = UNORM_INT8;
    if ((void *)local_2e8.m_pixels.m_cap != (void *)0x0) {
      local_2e8.m_pixels.m_cap = (size_t)local_2e8.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)local_328,(TextureFormat *)local_280,local_2e8.m_width,
               local_2e8.m_height,1,(void *)local_2e8.m_pixels.m_cap);
    bVar9 = tcu::bilinearCompare
                      (pTVar8,"CompareResult","Image Comparison Result",
                       (ConstPixelBufferAccess *)local_1b0,(ConstPixelBufferAccess *)local_328,
                       (RGBA)(local_2a8._4_4_ << 8 | local_2a8._0_4_ |
                             local_2a8._8_4_ << 0x10 | local_2a8._12_4_ << 0x18),COMPARE_LOG_RESULT)
    ;
  }
  local_1b0 = (undefined1  [8])
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&fStack_1a8);
  pcVar22 = "  FAILED!";
  if (bVar9 != false) {
    pcVar22 = "  Passed.";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&fStack_1a8,pcVar22,9);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&fStack_1a8);
  std::ios_base::~ios_base((ios_base *)&uStack_138);
  if ((bVar9 & GVar14 == 0) == 0) {
    pcVar22 = "Image comparison failed";
    if (bVar9 != false) {
      pcVar22 = "GL error";
    }
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               pcVar22);
  }
  if (local_2c8.
      super__Vector_base<deqp::gls::InteractionTestUtil::RenderCommand,_std::allocator<deqp::gls::InteractionTestUtil::RenderCommand>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2c8.
                    super__Vector_base<deqp::gls::InteractionTestUtil::RenderCommand,_std::allocator<deqp::gls::InteractionTestUtil::RenderCommand>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_2c8.
                          super__Vector_base<deqp::gls::InteractionTestUtil::RenderCommand,_std::allocator<deqp::gls::InteractionTestUtil::RenderCommand>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2c8.
                          super__Vector_base<deqp::gls::InteractionTestUtil::RenderCommand,_std::allocator<deqp::gls::InteractionTestUtil::RenderCommand>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  tcu::TestLog::endSection(local_240.m_log);
  tcu::Surface::~Surface(&local_300);
  tcu::Surface::~Surface(&local_2e8);
  return (uint)(byte)((iVar10 < 10 && GVar14 == 0) & bVar9);
}

Assistant:

RandomFragmentOpCase::IterateResult RandomFragmentOpCase::iterate (void)
{
	const glw::Functions&	gl				= m_context.getRenderContext().getFunctions();
	const bool				isMSAA			= m_context.getRenderTarget().getNumSamples() > 1;
	const deUint32			iterSeed		= deUint32Hash(m_seed) ^ deInt32Hash(m_iterNdx) ^ deInt32Hash(m_testCtx.getCommandLine().getBaseSeed());
	de::Random				rnd				(iterSeed);

	const int				width			= m_refColorBuffer->getWidth();
	const int				height			= m_refColorBuffer->getHeight();
	const int				viewportX		= rnd.getInt(0, m_context.getRenderTarget().getWidth()-width);
	const int				viewportY		= rnd.getInt(0, m_context.getRenderTarget().getHeight()-height);

	tcu::Surface			renderedImg		(width, height);
	tcu::Surface			referenceImg	(width, height);

	const Vec4				clearColor		= CLEAR_COLOR;
	const float				clearDepth		= CLEAR_DEPTH;
	const int				clearStencil	= CLEAR_STENCIL;

	bool					gotError		= false;

	const tcu::ScopedLogSection	iterSection	(m_testCtx.getLog(), std::string("Iteration") + de::toString(m_iterNdx), std::string("Iteration ") + de::toString(m_iterNdx));

	// Compute randomized rendering commands.
	vector<RenderCommand> commands;
	computeRandomRenderCommands(rnd, glu::ApiType::es(2,0), NUM_CALLS_PER_ITERATION, width, height, commands);

	// Reset default fragment state.
	gl.disable(GL_SCISSOR_TEST);
	gl.colorMask(GL_TRUE, GL_TRUE, GL_TRUE, GL_TRUE);
	gl.depthMask(GL_TRUE);
	gl.stencilMask(~0u);

	// Render using GL.
	m_callLogWrapper.glClearColor(clearColor.x(), clearColor.y(), clearColor.z(), clearColor.w());
	m_callLogWrapper.glClearDepthf(clearDepth);
	m_callLogWrapper.glClearStencil(clearStencil);
	m_callLogWrapper.glClear(GL_COLOR_BUFFER_BIT|GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT);
	m_callLogWrapper.glViewport(viewportX, viewportY, width, height);

	for (vector<RenderCommand>::const_iterator cmd = commands.begin(); cmd != commands.end(); cmd++)
	{
		setGLState(m_callLogWrapper, cmd->state, viewportX, viewportY);

		if (ENABLE_CALL_LOG)
			m_testCtx.getLog() << TestLog::Message << "// Quad: " << cmd->quad.posA << " -> " << cmd->quad.posB
												   << ", color: [" << cmd->quad.color[0] << ", " << cmd->quad.color[1] << ", " << cmd->quad.color[2] << ", " << cmd->quad.color[3] << "]"
												   << ", depth: [" << cmd->quad.depth[0] << ", " << cmd->quad.depth[1] << ", " << cmd->quad.depth[2] << ", " << cmd->quad.depth[3] << "]"
								<< TestLog::EndMessage;

		renderQuad(gl, *m_renderer, cmd->quad, viewportX, viewportY);
	}

	// Check error.
	if (m_callLogWrapper.glGetError() != GL_NO_ERROR)
		gotError = true;

	gl.flush();

	// Render reference while GPU is doing work.
	tcu::clear			(m_refColorBuffer->getAccess(),		clearColor);
	tcu::clearDepth		(m_refDepthBuffer->getAccess(),		clearDepth);
	tcu::clearStencil	(m_refStencilBuffer->getAccess(),	clearStencil);

	for (vector<RenderCommand>::const_iterator cmd = commands.begin(); cmd != commands.end(); cmd++)
	{
		rr::FragmentOperationState refState;
		translateState(cmd->state, refState, m_context.getRenderTarget());
		m_refRenderer->render(gls::FragmentOpUtil::getMultisampleAccess(m_refColorBuffer->getAccess()),
							  gls::FragmentOpUtil::getMultisampleAccess(m_refDepthBuffer->getAccess()),
							  gls::FragmentOpUtil::getMultisampleAccess(m_refStencilBuffer->getAccess()),
							  cmd->quad, refState);
	}

	// Expand reference color buffer to RGBA8
	copy(referenceImg.getAccess(), m_refColorBuffer->getAccess());

	// Read rendered image.
	glu::readPixels(m_context.getRenderContext(), viewportX, viewportY, renderedImg.getAccess());

	m_iterNdx += 1;

	// Compare to reference.
	bool				isLastIter	= m_iterNdx >= NUM_ITERATIONS_PER_CASE;
	const tcu::UVec4	threshold	= getCompareThreshold();
	bool				compareOk;

	if (isMSAA)
	{
		// in MSAA cases, the sampling points could be anywhere in the pixel and we could
		// even have multiple samples that are combined in resolve. Allow arbitrary sample
		// positions by using bilinearCompare.
		compareOk = tcu::bilinearCompare(m_testCtx.getLog(),
										 "CompareResult",
										 "Image Comparison Result",
										 referenceImg.getAccess(),
										 renderedImg.getAccess(),
										 tcu::RGBA(threshold.x(), threshold.y(), threshold.z(), threshold.w()),
										 tcu::COMPARE_LOG_RESULT);
	}
	else
		compareOk = tcu::intThresholdCompare(m_testCtx.getLog(),
											 "CompareResult",
											 "Image Comparison Result",
											 referenceImg.getAccess(),
											 renderedImg.getAccess(),
											 threshold,
											 tcu::COMPARE_LOG_RESULT);

	m_testCtx.getLog() << TestLog::Message << (compareOk ? "  Passed." : "  FAILED!") << TestLog::EndMessage;

	if (!compareOk)
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image comparison failed");
	else if (gotError)
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "GL error");

	if (compareOk && !gotError && !isLastIter)
		return CONTINUE;
	else
		return STOP;
}